

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O0

bool __thiscall Turn::removeTurn(Turn *this,NurseSolution *nurseSolution)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<NurseSolution_**,_std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>_>
  local_30;
  const_iterator local_28;
  NurseSolution *local_20;
  NurseSolution *nurseSolution_local;
  Turn *this_local;
  
  local_20 = nurseSolution;
  nurseSolution_local = (NurseSolution *)this;
  bVar1 = hasNurse(this,nurseSolution);
  if ((bVar1) && (bVar1 = NurseSolution::hasTurn(local_20,this), bVar1)) {
    __first = std::begin<std::vector<NurseSolution*,std::allocator<NurseSolution*>>>(&this->nurses);
    __last = std::end<std::vector<NurseSolution*,std::allocator<NurseSolution*>>>(&this->nurses);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<NurseSolution**,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>,NurseSolution*>
                         (__first._M_current,__last._M_current,&local_20);
    __gnu_cxx::
    __normal_iterator<NurseSolution*const*,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>
    ::__normal_iterator<NurseSolution**>
              ((__normal_iterator<NurseSolution*const*,std::vector<NurseSolution*,std::allocator<NurseSolution*>>>
                *)&local_28,&local_30);
    std::vector<NurseSolution_*,_std::allocator<NurseSolution_*>_>::erase(&this->nurses,local_28);
    NurseSolution::removeTurn(local_20,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

const bool Turn::removeTurn(NurseSolution *nurseSolution) {
    if (!hasNurse(nurseSolution) || !nurseSolution->hasTurn(this))
        return false;

    nurses.erase(find(begin(nurses), end(nurses), nurseSolution));
    nurseSolution->removeTurn(this);

    return true;
}